

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

InstanceConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceConfigRuleSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax>&,slang::syntax::ConfigRuleClauseSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,
          SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *args_2,
          ConfigRuleClauseSyntax *args_3,Token *args_4)

{
  size_t sVar1;
  pointer ppCVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  SyntaxNode *pSVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  undefined4 uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  InstanceConfigRuleSyntax *pIVar20;
  long lVar21;
  
  pIVar20 = (InstanceConfigRuleSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceConfigRuleSyntax *)this->endPtr < pIVar20 + 1) {
    pIVar20 = (InstanceConfigRuleSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pIVar20 + 1);
  }
  TVar7 = args->kind;
  uVar8 = args->field_0x2;
  NVar9.raw = (args->numFlags).raw;
  uVar10 = args->rawLen;
  pIVar3 = args->info;
  TVar11 = args_1->kind;
  uVar12 = args_1->field_0x2;
  NVar13.raw = (args_1->numFlags).raw;
  uVar14 = args_1->rawLen;
  pIVar4 = args_1->info;
  TVar16 = args_4->kind;
  uVar17 = args_4->field_0x2;
  NVar18.raw = (args_4->numFlags).raw;
  uVar19 = args_4->rawLen;
  pIVar5 = args_4->info;
  (pIVar20->super_ConfigRuleSyntax).super_SyntaxNode.kind = InstanceConfigRule;
  (pIVar20->super_ConfigRuleSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar20->super_ConfigRuleSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pIVar20->instance).kind = TVar7;
  (pIVar20->instance).field_0x2 = uVar8;
  (pIVar20->instance).numFlags = (NumericTokenFlags)NVar9.raw;
  (pIVar20->instance).rawLen = uVar10;
  (pIVar20->instance).info = pIVar3;
  (pIVar20->topModule).kind = TVar11;
  (pIVar20->topModule).field_0x2 = uVar12;
  (pIVar20->topModule).numFlags = (NumericTokenFlags)NVar13.raw;
  (pIVar20->topModule).rawLen = uVar14;
  (pIVar20->topModule).info = pIVar4;
  uVar15 = *(undefined4 *)&(args_2->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar6 = (args_2->super_SyntaxListBase).super_SyntaxNode.parent;
  (pIVar20->instanceNames).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_2->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar20->instanceNames).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar15;
  (pIVar20->instanceNames).super_SyntaxListBase.super_SyntaxNode.parent = pSVar6;
  (pIVar20->instanceNames).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_2->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pIVar20->instanceNames).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (pIVar20->instanceNames).super_SyntaxListBase.childCount =
       (args_2->super_SyntaxListBase).childCount;
  sVar1 = (args_2->
          super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pIVar20->instanceNames).
  super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>._M_ptr =
       (args_2->super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>)
       ._M_ptr;
  (pIVar20->instanceNames).
  super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (pIVar20->instanceNames).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006a5ae0;
  (pIVar20->ruleClause).ptr = args_3;
  (pIVar20->semi).kind = TVar16;
  (pIVar20->semi).field_0x2 = uVar17;
  (pIVar20->semi).numFlags = (NumericTokenFlags)NVar18.raw;
  (pIVar20->semi).rawLen = uVar19;
  (pIVar20->semi).info = pIVar5;
  (pIVar20->instanceNames).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pIVar20;
  sVar1 = (pIVar20->instanceNames).
          super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppCVar2 = (pIVar20->instanceNames).
              super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar21 = 0;
    do {
      *(InstanceConfigRuleSyntax **)(*(long *)((long)ppCVar2 + lVar21) + 8) = pIVar20;
      lVar21 = lVar21 + 8;
    } while (sVar1 << 3 != lVar21);
  }
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pIVar20;
  return pIVar20;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }